

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

void __thiscall cfd::core::Script::SetStackData(Script *this,ByteData *bytedata)

{
  byte bVar1;
  pointer pSVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  int64_t value;
  iterator iVar8;
  size_type sVar9;
  ulong uVar10;
  InvalidScriptException *pIVar11;
  ulong uVar12;
  Script *this_00;
  uint uVar13;
  uint uVar14;
  ScriptType SVar15;
  size_type __new_size;
  int64_t *int64_value;
  initializer_list<cfd::core::ScriptType> __l;
  initializer_list<cfd::core::ScriptType> __l_00;
  initializer_list<cfd::core::ScriptType> __l_01;
  ScriptType type;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_1a0;
  Script *local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> collect_buffer;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> top_collect_buffer;
  ScriptElement script_element;
  int64_t values [5];
  ByteData byte_array;
  
  ByteData::GetBytes(&buffer,bytedata);
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1 == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1),
     iVar6 != 0)) {
    script_element.op_code_._vptr_ScriptOperator = (_func_int **)0x900000008f;
    script_element.op_code_.data_type_ = kOpNot;
    script_element.op_code_._12_4_ = 0x92;
    script_element._vptr_ScriptElement = (_func_int **)0xb1000000b2;
    script_element.type_ = 0x8b;
    script_element._12_4_ = 0x8c;
    script_element.op_code_.text_data_._M_dataplus._M_p = (pointer)0x7a00000079;
    __l._M_len = 10;
    __l._M_array = (iterator)&script_element;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum1,__l,(less<cfd::core::ScriptType> *)&byte_array,
          (allocator_type *)values);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum1,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum1);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2 == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2),
     iVar6 != 0)) {
    script_element.op_code_.text_data_._M_dataplus._M_p = (pointer)0xa10000009a;
    script_element.op_code_.text_data_._M_string_length = 0xa4000000a3;
    script_element.op_code_._vptr_ScriptOperator = (_func_int **)0x9d0000009c;
    script_element.op_code_.data_type_ = kOpNumNotEqual;
    script_element.op_code_._12_4_ = 0x9f;
    script_element._vptr_ScriptElement = (_func_int **)0x9400000093;
    script_element.type_ = 0xa0;
    script_element._12_4_ = 0x9b;
    script_element.op_code_.text_data_.field_2._M_allocated_capacity._0_4_ = 0xa2;
    __l_00._M_len = 0xd;
    __l_00._M_array = (iterator)&script_element;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum2,__l_00,(less<cfd::core::ScriptType> *)&byte_array,
          (allocator_type *)values);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum2,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum2);
  }
  if ((SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3 == '\0') &&
     (iVar6 = __cxa_guard_acquire(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3),
     iVar6 != 0)) {
    script_element._vptr_ScriptElement = (_func_int **)0xba000000a5;
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)&script_element;
    ::std::
    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
    ::set(&SetStackData::kUseScriptNum3,__l_01,(less<cfd::core::ScriptType> *)&byte_array,
          (allocator_type *)values);
    __cxa_atexit(::std::
                 set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                 ::~set,&SetStackData::kUseScriptNum3,&__dso_handle);
    __cxa_guard_release(&SetStackData(cfd::core::ByteData_const&)::kUseScriptNum3);
  }
  collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&top_collect_buffer,2,(allocator_type *)&script_element);
  local_1a0 = &this->script_stack_;
  uVar10 = 0;
  do {
    iVar6 = (int)uVar10;
    uVar12 = (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (uVar12 <= uVar10) {
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&top_collect_buffer);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    bVar1 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar10];
    __new_size = (size_type)bVar1;
    if (bVar1 == 0) {
      ScriptElement::ScriptElement(&script_element,(ScriptOperator *)ScriptOperator::OP_0);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::push_back
                (local_1a0,&script_element);
      goto LAB_00356f85;
    }
    if (bVar1 < 0x4c) {
      uVar10 = (ulong)(iVar6 + 1);
LAB_00356dd2:
      if (collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             collect_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&collect_buffer,__new_size);
      iVar6 = (int)uVar10;
      if ((ulong)((long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) <
          (ulong)(uint)((int)__new_size + iVar6)) {
        if ((((ulong)(((long)(this->script_stack_).
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->script_stack_).
                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x60) < 2) ||
            (sVar7 = ByteData::GetDataSize
                               (top_collect_buffer.
                                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                ._M_impl.super__Vector_impl_data._M_start), sVar7 != 3)) ||
           (sVar7 = ByteData::GetDataSize
                              (top_collect_buffer.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1),
           puVar4 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_finish,
           puVar3 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start, sVar7 != 4)) {
          script_element._vptr_ScriptElement = (_func_int **)0x4af064;
          script_element.type_ = 0x3c2;
          script_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_49dd31;
          logger::warn<>((CfdSourceLocation *)&script_element,"buffer is incorrect size.");
          pIVar11 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&script_element,"buffer is incorrect size.",(allocator *)&byte_array)
          ;
          InvalidScriptException::InvalidScriptException(pIVar11,(string *)&script_element);
          __cxa_throw(pIVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
        }
        script_element._vptr_ScriptElement = (_func_int **)0x4af064;
        script_element.type_ = 0x3c0;
        script_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_49dd31;
        logger::warn<>((CfdSourceLocation *)&script_element,"This script is coinbase scriptsig?");
        __new_size = (size_type)(uint)(((int)puVar4 - (int)puVar3) - iVar6);
      }
      uVar14 = (uint)__new_size;
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&collect_buffer,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar10 & 0xffffffff),
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (uVar10 & 0xffffffff) + __new_size);
      if ((ulong)(((long)(this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->script_stack_).
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x60) <
          (ulong)(((long)top_collect_buffer.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)top_collect_buffer.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        ByteData::ByteData((ByteData *)&script_element,&collect_buffer);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&((top_collect_buffer.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start +
                   ((long)(this->script_stack_).
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->script_stack_).
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2)),&script_element);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script_element);
      }
      if (uVar14 < 5) {
        this_00 = (Script *)&stack0xffffffffffffffb8;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffb8
                   ,&collect_buffer);
        value = ConvertToNumber(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &stack0xffffffffffffffb8);
        ScriptElement::ScriptElement(&script_element,value,true);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &stack0xffffffffffffffb8);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(local_1a0,&script_element);
        ScriptElement::~ScriptElement(&script_element);
      }
      else {
        ByteData::ByteData(&byte_array,&collect_buffer);
        ScriptElement::ScriptElement(&script_element,&byte_array);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(local_1a0,&script_element);
        ScriptElement::~ScriptElement(&script_element);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_array);
      }
    }
    else {
      SVar15 = (ScriptType)bVar1;
      if (SVar15 == kOpPushData4) {
        uVar10 = (ulong)(iVar6 + 1) + 4;
        if (uVar12 <= uVar10) {
          script_element._vptr_ScriptElement = (_func_int **)0x4af064;
          script_element.type_ = 0x372;
          script_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_49dd31;
          logger::warn<>((CfdSourceLocation *)&script_element,"OP_PUSHDATA4 is incorrect size.");
          pIVar11 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&script_element,"OP_PUSHDATA4 is incorrect size.",
                     (allocator *)&byte_array);
          InvalidScriptException::InvalidScriptException(pIVar11,(string *)&script_element);
          __cxa_throw(pIVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
        }
        __new_size = (size_type)
                     *(uint *)(buffer.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + (iVar6 + 1));
        goto LAB_00356dd2;
      }
      if (SVar15 == kOpPushData2) {
        uVar10 = (ulong)(iVar6 + 1) + 2;
        if (uVar12 <= uVar10) {
          script_element._vptr_ScriptElement = (_func_int **)0x4af064;
          script_element.type_ = 0x365;
          script_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_49dd31;
          logger::warn<>((CfdSourceLocation *)&script_element,"OP_PUSHDATA2 is incorrect size.");
          pIVar11 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&script_element,"OP_PUSHDATA2 is incorrect size.",
                     (allocator *)&byte_array);
          InvalidScriptException::InvalidScriptException(pIVar11,(string *)&script_element);
          __cxa_throw(pIVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
        }
        __new_size = (size_type)
                     *(ushort *)
                      (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + (iVar6 + 1));
        goto LAB_00356dd2;
      }
      if (SVar15 == kOpPushData1) {
        uVar10 = (ulong)(iVar6 + 2);
        if (uVar12 <= uVar10) {
          script_element._vptr_ScriptElement = (_func_int **)0x4af064;
          script_element.type_ = 0x35a;
          script_element.op_code_._vptr_ScriptOperator = (_func_int **)anon_var_dwarf_49dd31;
          logger::warn<>((CfdSourceLocation *)&script_element,"OP_PUSHDATA1 is incorrect size.");
          pIVar11 = (InvalidScriptException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&script_element,"OP_PUSHDATA1 is incorrect size.",
                     (allocator *)&byte_array);
          InvalidScriptException::InvalidScriptException(pIVar11,(string *)&script_element);
          __cxa_throw(pIVar11,&InvalidScriptException::typeinfo,CfdException::~CfdException);
        }
        __new_size = (size_type)
                     buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar6 + 1];
        goto LAB_00356dd2;
      }
      type = SVar15;
      if ((g_operator_map._40_8_ != 0) &&
         (iVar8 = ::std::
                  _Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                  ::find((_Rb_tree<cfd::core::ScriptType,_std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                          *)g_operator_map,&type), iVar8._M_node != (_Base_ptr)(g_operator_map + 8))
         ) {
        ScriptElement::ScriptElement(&script_element,(ScriptOperator *)&iVar8._M_node[1]._M_parent);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
        push_back(local_1a0,&script_element);
        sVar9 = ::std::
                set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                ::count(&SetStackData::kUseScriptNum1,&type);
        if (sVar9 == 0) {
          sVar9 = ::std::
                  set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                  ::count(&SetStackData::kUseScriptNum2,&type);
          if (sVar9 == 0) {
            sVar9 = ::std::
                    set<cfd::core::ScriptType,_std::less<cfd::core::ScriptType>,_std::allocator<cfd::core::ScriptType>_>
                    ::count(&SetStackData::kUseScriptNum3,&type);
            if ((sVar9 != 0) &&
               (uVar10 = ((long)(this->script_stack_).
                                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->script_stack_).
                               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x60, 3 < uVar10)) {
              uVar14 = 3;
              goto LAB_0035714b;
            }
          }
          else {
            uVar10 = ((long)(this->script_stack_).
                            super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->script_stack_).
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x60;
            if (2 < uVar10) {
              uVar14 = 2;
LAB_0035714b:
              int64_value = values;
              uVar13 = 0;
              local_198 = this;
              for (uVar12 = 0; this = local_198, uVar14 != uVar12; uVar12 = uVar12 + 1) {
                bVar5 = ScriptElement::ConvertBinaryToNumber
                                  ((local_1a0->
                                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                   )._M_impl.super__Vector_impl_data._M_start +
                                   ((int)uVar12 + ~uVar14 + (int)uVar10),int64_value);
                uVar13 = uVar13 + bVar5;
                int64_value = int64_value + 1;
              }
              if (uVar13 == uVar14) {
                pSVar2 = (local_1a0->
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
                  ScriptElement::ScriptElement((ScriptElement *)&byte_array,values[uVar12]);
                  ScriptElement::operator=
                            (pSVar2 + ((int)uVar12 + ~uVar14 + (int)uVar10),
                             (ScriptElement *)&byte_array);
                  ScriptElement::~ScriptElement((ScriptElement *)&byte_array);
                }
              }
            }
          }
        }
        else {
          uVar10 = ((long)(this->script_stack_).
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->script_stack_).
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x60;
          if (1 < uVar10) {
            uVar14 = 1;
            goto LAB_0035714b;
          }
        }
LAB_00356f85:
        ScriptElement::~ScriptElement(&script_element);
      }
      uVar14 = 1;
    }
    uVar10 = (ulong)(iVar6 + uVar14);
  } while( true );
}

Assistant:

void Script::SetStackData(const ByteData& bytedata) {
  std::vector<uint8_t> buffer = bytedata.GetBytes();
  static const std::set<ScriptType> kUseScriptNum1{
      kOpCheckSequenceVerify,
      kOpCheckLockTimeVerify,
      kOp1Add,
      kOp1Sub,
      kOpNegate,
      kOpAbs,
      kOpNot,
      kOp0NotEqual,
      kOpPick,
      kOpRoll};
  static const std::set<ScriptType> kUseScriptNum2{
      kOpAdd,
      kOpSub,
      kOpGreaterThan,
      kOpBoolOr,
      kOpNumEqual,
      kOpNumEqualVerify,
      kOpNumNotEqual,
      kOpLessThan,
      kOpBoolAnd,
      kOpLessThanOrEqual,
      kOpMin,
      kOpMax,
      kOpGreaterThanOrEqual};
  static const std::set<ScriptType> kUseScriptNum3{kOpWithIn, kOpCheckSigAdd};

  // create stack
  bool is_collect_buffer = false;
  uint32_t collect_buffer_size = 0;
  std::vector<uint8_t> collect_buffer;
  std::vector<ByteData> top_collect_buffer(2);
  uint32_t offset = 0;
  while (offset < buffer.size()) {
    uint8_t view_data = buffer[offset];
    if (kOp_0 == view_data) {
      // @formatter:off
      ScriptElement script_element = ScriptElement(ScriptOperator::OP_0);
      // @formatter:on
      script_stack_.push_back(script_element);

    } else if (view_data < kOpPushData1) {
      collect_buffer_size = view_data;
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData1) {
      ++offset;
      if ((offset + 1) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA1 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA1 is incorrect size.");
      }
      collect_buffer_size = buffer[offset];
      is_collect_buffer = true;
      ++offset;

    } else if (view_data == kOpPushData2) {
      ++offset;
      uint16_t ushort_value = 0;
      if ((offset + sizeof(uint16_t)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA2 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA2 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&ushort_value, &buffer[offset], sizeof(ushort_value));
      collect_buffer_size = ushort_value;
      offset += sizeof(ushort_value);
      is_collect_buffer = true;

    } else if (view_data == kOpPushData4) {
      ++offset;
      uint32_t uint_value = 0;
      if ((offset + sizeof(uint_value)) >= buffer.size()) {
        warn(CFD_LOG_SOURCE, "OP_PUSHDATA4 is incorrect size.");
        throw InvalidScriptException("OP_PUSHDATA4 is incorrect size.");
      }
      // process under LittleEndian
      memcpy(&uint_value, &buffer[offset], sizeof(uint_value));
      collect_buffer_size = uint_value;
      offset += sizeof(uint_value);
      is_collect_buffer = true;

    } else {
      // if ((bytedata == OP_0) || ((byteadata >= OP_PUSHDATA1)
      //     && (byteadata <= OP_NOP10)))
      // TODO(k-matsuzawa): Considering script extension, do not perform strict check of OP value.  // NOLINT

      // Setting for ScriptOperator
      ScriptType type = (ScriptType)view_data;
      if (!g_operator_map.empty()) {
        decltype(g_operator_map)::const_iterator ite =
            g_operator_map.find(type);
        if (ite != g_operator_map.end()) {
          ScriptElement script_element = ScriptElement(ite->second);
          script_stack_.push_back(script_element);

          // Since bytedata is stored as numerica type, after decoding bytedata
          // Re-convert to numeric type based on the contents of OP_CODE.
          /// Since OP_CHECKMULTISIG and OP_CHECKMULTISIGVERIFY are
          // in the range of OP_1-OP_16, they are excluded from
          // this conversion process.
          uint32_t convert_count = 0;
          if (kUseScriptNum1.count(type) > 0) {
            if (script_stack_.size() > 1) {
              convert_count = 1;
            }
          } else if (kUseScriptNum2.count(type) > 0) {
            if (script_stack_.size() > 2) {
              convert_count = 2;
            }
          } else if (kUseScriptNum3.count(type) > 0) {
            if (script_stack_.size() > 3) {
              convert_count = 3;
            }
          }

          static constexpr uint32_t kMaxArray = 5;
          if ((convert_count != 0) && (convert_count <= kMaxArray)) {
            int64_t values[kMaxArray];
            uint32_t stack_offset =
                static_cast<uint32_t>(script_stack_.size());
            stack_offset -= convert_count + 1;
            uint32_t check_count = 0;
            for (uint32_t index = 0; index < convert_count; ++index) {
              if (script_stack_[stack_offset + index].ConvertBinaryToNumber(
                      &values[index])) {
                ++check_count;
              }
            }
            if (check_count == convert_count) {
              ScriptElement* pointer = script_stack_.data();
              for (uint32_t index = 0; index < convert_count; ++index) {
                pointer[stack_offset + index] = ScriptElement(values[index]);
              }
            }
          }
        }
      }
    }

    if (is_collect_buffer) {
      collect_buffer.clear();
      collect_buffer.resize(collect_buffer_size);
      auto tmp_collect_buffer_size = collect_buffer_size;
      if ((offset + collect_buffer_size) > buffer.size()) {
        if ((script_stack_.size() >= 2) &&
            (top_collect_buffer[0].GetDataSize() == 3) &&
            (top_collect_buffer[1].GetDataSize() == 4)) {
          // (push past end) If script is coinbase scriptsig, length is low.
          tmp_collect_buffer_size =
              static_cast<uint32_t>(buffer.size()) - offset;
          warn(CFD_LOG_SOURCE, "This script is coinbase scriptsig?");
        } else {
          warn(CFD_LOG_SOURCE, "buffer is incorrect size.");
          throw InvalidScriptException("buffer is incorrect size.");
        }
      }

      // OK
      collect_buffer.assign(
          buffer.begin() + offset,
          buffer.begin() + offset + tmp_collect_buffer_size);

      if (top_collect_buffer.size() > script_stack_.size()) {
        // for coinbase script check
        top_collect_buffer[script_stack_.size()] = ByteData(collect_buffer);
      }
      if (tmp_collect_buffer_size <= kMaxScriptNumSize) {
        ScriptElement script_element =
            ScriptElement(ConvertToNumber(collect_buffer), true);
        script_stack_.push_back(script_element);
      } else {
        ByteData byte_array = ByteData(collect_buffer);
        ScriptElement script_element = ScriptElement(byte_array);
        script_stack_.push_back(script_element);
      }
      offset += tmp_collect_buffer_size;
      is_collect_buffer = false;
    } else {
      ++offset;
    }
  }
  if (is_collect_buffer) {
    // incorrect script
    warn(CFD_LOG_SOURCE, "incorrect script data.");
    throw InvalidScriptException("incorrect script data.");
  }
}